

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_posix.c
# Opt level: O0

char * ethash_io_create_filename(char *dirname,char *filename,size_t filename_length)

{
  long lVar1;
  size_t dest_size_00;
  char *in_RDX;
  char *in_RDI;
  char *name;
  size_t dest_size;
  size_t dirlen;
  char *src;
  char *local_8;
  
  dest_size_00 = strlen(in_RDI);
  lVar1 = dest_size_00 + 1;
  if (in_RDI[dest_size_00] != '/') {
    lVar1 = dest_size_00 + 2;
  }
  src = in_RDX + lVar1;
  local_8 = (char *)malloc((size_t)src);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    *local_8 = '\0';
    ethash_strncat(in_RDX,dest_size_00,src,(size_t)local_8);
    if (in_RDI[dest_size_00] != '/') {
      ethash_strncat(in_RDX,dest_size_00,src,(size_t)local_8);
    }
    ethash_strncat(in_RDX,dest_size_00,src,(size_t)local_8);
  }
  return local_8;
}

Assistant:

char* ethash_io_create_filename(
	char const* dirname,
	char const* filename,
	size_t filename_length
)
{
	size_t dirlen = strlen(dirname);
	size_t dest_size = dirlen + filename_length + 1;
	if (dirname[dirlen] != '/') {
		dest_size += 1;
	}
	char* name = malloc(dest_size);
	if (!name) {
		return NULL;
	}

	name[0] = '\0';
	ethash_strncat(name, dest_size, dirname, dirlen);
	if (dirname[dirlen] != '/') {
		ethash_strncat(name, dest_size, "/", 1);
	}
	ethash_strncat(name, dest_size, filename, filename_length);
	return name;
}